

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

rtosc_arg_t extract_arg(uint8_t *arg_pos,char type)

{
  rtosc_arg_t rVar1;
  int iVar2;
  char in_SIL;
  byte *in_RDI;
  rtosc_arg_t result;
  byte local_10;
  byte bStack_f;
  byte bStack_e;
  byte bStack_d;
  uint uStack_c;
  byte *local_8;
  
  local_10 = 0;
  bStack_f = 0;
  bStack_e = 0;
  bStack_d = 0;
  uStack_c = 0;
  local_8 = (byte *)0x0;
  iVar2 = has_reserved(in_SIL);
  if (iVar2 == 0) {
    if (in_SIL == 'F') {
      local_10 = 0;
    }
    else if (in_SIL == 'T') {
      local_10 = 1;
    }
  }
  else {
    switch(in_SIL) {
    case 'S':
    case 's':
      local_10 = (byte)in_RDI;
      bStack_f = (byte)((ulong)in_RDI >> 8);
      bStack_e = (byte)((ulong)in_RDI >> 0x10);
      bStack_d = (byte)((ulong)in_RDI >> 0x18);
      uStack_c = (uint)((ulong)in_RDI >> 0x20);
      break;
    case 'b':
      bStack_d = *in_RDI;
      bStack_e = in_RDI[1];
      bStack_f = in_RDI[2];
      local_8 = in_RDI + 4;
      local_10 = in_RDI[3];
      break;
    case 'c':
    case 'f':
    case 'i':
    case 'r':
      bStack_d = *in_RDI;
      bStack_e = in_RDI[1];
      bStack_f = in_RDI[2];
      local_10 = in_RDI[3];
      break;
    case 'd':
    case 'h':
    case 't':
      uStack_c = (uint)(((ulong)in_RDI[1] << 0x30) >> 0x20) |
                 (uint)(((ulong)*in_RDI << 0x38) >> 0x20);
      uStack_c = (uint)(((ulong)in_RDI[2] << 0x28) >> 0x20) | uStack_c;
      uStack_c = in_RDI[3] | uStack_c;
      bStack_d = in_RDI[4];
      bStack_e = in_RDI[5];
      bStack_f = in_RDI[6];
      local_10 = in_RDI[7];
      break;
    case 'm':
      local_10 = *in_RDI;
      bStack_f = in_RDI[1];
      bStack_e = in_RDI[2];
      bStack_d = in_RDI[3];
    }
  }
  rVar1.m[1] = bStack_f;
  rVar1.T = local_10;
  rVar1.m[2] = bStack_e;
  rVar1.m[3] = bStack_d;
  rVar1.h._4_4_ = uStack_c;
  rVar1.b.data = local_8;
  return rVar1;
}

Assistant:

static rtosc_arg_t extract_arg(const uint8_t *arg_pos, char type)
{
    rtosc_arg_t result = {0};
    //trivial case
    if(!has_reserved(type)) {
        switch(type)
        {
            case 'T':
                result.T = true;
                break;
            case 'F':
                result.T = false;
                break;
            default:
                ;
        }
    } else {
        switch(type)
        {
            case 'h':
            case 't':
            case 'd':
                result.t |= (((uint64_t)*arg_pos++) << 56);
                result.t |= (((uint64_t)*arg_pos++) << 48);
                result.t |= (((uint64_t)*arg_pos++) << 40);
                result.t |= (((uint64_t)*arg_pos++) << 32);
                result.t |= (((uint64_t)*arg_pos++) << 24);
                result.t |= (((uint64_t)*arg_pos++) << 16);
                result.t |= (((uint64_t)*arg_pos++) << 8);
                result.t |= (((uint64_t)*arg_pos++));
                break;
            case 'r':
            case 'f':
            case 'c':
            case 'i':
                result.i |= (*arg_pos++ << 24);
                result.i |= (*arg_pos++ << 16);
                result.i |= (*arg_pos++ << 8);
                result.i |= (*arg_pos++);
                break;
            case 'm':
                result.m[0] = *arg_pos++;
                result.m[1] = *arg_pos++;
                result.m[2] = *arg_pos++;
                result.m[3] = *arg_pos++;
                break;
            case 'b':
                result.b.len |= (*arg_pos++ << 24);
                result.b.len |= (*arg_pos++ << 16);
                result.b.len |= (*arg_pos++ << 8);
                result.b.len |= (*arg_pos++);
                result.b.data = (unsigned char *)arg_pos;
                break;
            case 'S':
            case 's':
                result.s = (char *)arg_pos;
                break;
        }
    }

    return result;
}